

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.c
# Opt level: O2

void w_handle_failed_assertion(char *expr,char *fn,char *file,int line)

{
  int iVar1;
  char msg [1024];
  
  iVar1 = w_format_msg(msg,0x400,
                       "---------------------------\n /!\\ ASSERTION FAILURE /!\\ \n---------------------------\nexpression : %s\n  function : %s\n      file : %s\n      line : %d\n"
                       ,expr,fn,file,line);
  if (iVar1 == 0) {
    w_print(_stderr,msg);
  }
  w_abort(-1);
  return;
}

Assistant:

void
w_handle_failed_assertion(
    const char *expr,
    const char *fn,
    const char *file,
    int line
)
{
    char msg[1024];

    if (
        w_format_msg(
            msg,
            W_GET_ARRAY_LEN(msg),
            WP_ASSERT_ASSERTION_FAILURE_FMT,
            expr,
            fn,
            file,
            line
        )
        == 0
    )
    {
        w_print(W_STD_ERR, msg);
    }

    w_abort(-1);
}